

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilNam.c
# Opt level: O2

void Abc_NamStrHashResize(Abc_Nam_t *p)

{
  Vec_Int_t *p_00;
  int iVar1;
  int *__ptr;
  undefined8 uVar2;
  int iVar3;
  int Entry;
  int *piVar4;
  Vec_Int_t vInt2HandleOld;
  
  __ptr = p->pBins;
  if (__ptr == (int *)0x0) {
    __assert_fail("p->pBins != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilNam.c"
                  ,0x14f,"void Abc_NamStrHashResize(Abc_Nam_t *)");
  }
  iVar3 = Abc_PrimeCudd(p->nBins * 3);
  p->nBins = iVar3;
  piVar4 = (int *)calloc((long)iVar3,4);
  p->pBins = piVar4;
  p_00 = &p->vInt2Handle;
  uVar2._0_4_ = (p->vInt2Handle).nCap;
  uVar2._4_4_ = (p->vInt2Handle).nSize;
  vInt2HandleOld.pArray = (p->vInt2Handle).pArray;
  (p->vInt2Handle).nCap = 0;
  (p->vInt2Handle).nSize = 0;
  (p->vInt2Handle).pArray = (int *)0x0;
  vInt2HandleOld._0_8_ = uVar2;
  Vec_IntGrow(p_00,uVar2._4_4_ * 2);
  Vec_IntPush(p_00,-1);
  (p->vInt2Next).nSize = 0;
  Vec_IntPush(&p->vInt2Next,-1);
  iVar3 = 1;
  while( true ) {
    if (uVar2._4_4_ <= iVar3) {
      Vec_IntErase(&vInt2HandleOld);
      free(__ptr);
      return;
    }
    Entry = Vec_IntEntry(&vInt2HandleOld,iVar3);
    piVar4 = Abc_NamStrHashFind(p,p->pStore + Entry,(char *)0x0);
    if (*piVar4 != 0) break;
    iVar1 = (p->vInt2Handle).nSize;
    *piVar4 = iVar1;
    if (iVar3 != iVar1) {
      __assert_fail("Vec_IntSize( &p->vInt2Handle ) == i",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilNam.c"
                    ,0x162,"void Abc_NamStrHashResize(Abc_Nam_t *)");
    }
    Vec_IntPush(p_00,Entry);
    Vec_IntPush(&p->vInt2Next,0);
    iVar3 = iVar3 + 1;
  }
  __assert_fail("*piPlace == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilNam.c"
                ,0x160,"void Abc_NamStrHashResize(Abc_Nam_t *)");
}

Assistant:

void Abc_NamStrHashResize( Abc_Nam_t * p )
{
    Vec_Int_t vInt2HandleOld;  char * pThis; 
    int * piPlace, * pBinsOld, iHandleOld, i;//, clk = Abc_Clock();
    assert( p->pBins != NULL );
//    Abc_Print( 1, "Resizing names manager hash table from %6d to %6d. ", p->nBins, Abc_PrimeCudd( 3 * p->nBins ) );
    // replace the table
    pBinsOld = p->pBins;
    p->nBins = Abc_PrimeCudd( 3 * p->nBins ); 
    p->pBins = ABC_CALLOC( int, p->nBins );
    // replace the handles array
    vInt2HandleOld = p->vInt2Handle;
    Vec_IntZero( &p->vInt2Handle );
    Vec_IntGrow( &p->vInt2Handle, 2 * Vec_IntSize(&vInt2HandleOld) ); 
    Vec_IntPush( &p->vInt2Handle, -1 );
    Vec_IntClear( &p->vInt2Next );    Vec_IntPush( &p->vInt2Next, -1 );
    // rehash the entries from the old table
    Vec_IntForEachEntryStart( &vInt2HandleOld, iHandleOld, i, 1 )
    {
        pThis   = Abc_NamHandleToStr( p, iHandleOld );
        piPlace = Abc_NamStrHashFind( p, pThis, NULL );
        assert( *piPlace == 0 );
        *piPlace = Vec_IntSize( &p->vInt2Handle );
        assert( Vec_IntSize( &p->vInt2Handle ) == i );
        Vec_IntPush( &p->vInt2Handle, iHandleOld );
        Vec_IntPush( &p->vInt2Next,   0 );
    }
    Vec_IntErase( &vInt2HandleOld );
    ABC_FREE( pBinsOld );
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}